

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

void ZSTD_row_update(ZSTD_matchState_t *ms,BYTE *ip)

{
  BYTE *pBVar1;
  BYTE *pBVar2;
  U32 *pUVar3;
  byte bVar4;
  char cVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  byte bVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  BYTE BVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  
  uVar6 = (ms->cParams).searchLog;
  if (5 < uVar6) {
    uVar6 = 6;
  }
  uVar14 = 4;
  if (4 < uVar6) {
    uVar14 = uVar6;
  }
  uVar6 = (ms->cParams).minMatch;
  uVar17 = 6;
  if (uVar6 < 6) {
    uVar17 = uVar6;
  }
  bVar9 = (byte)uVar14;
  uVar6 = ms->nextToUpdate;
  uVar18 = (ulong)uVar6;
  pBVar1 = (ms->window).base;
  uVar14 = (uint)((long)ip - (long)pBVar1);
  if (uVar14 < uVar6) {
    __assert_fail("target >= idx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x397,
                  "void ZSTD_row_update_internal(ZSTD_matchState_t *, const BYTE *, const U32, const U32, const U32, const U32)"
                 );
  }
  if (uVar6 < uVar14) {
    if (0x20 < ms->rowHashLog + 8) {
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x353,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
    }
    uVar6 = ~(-1 << (bVar9 & 0x1f));
    pBVar2 = ms->tagTable;
    pUVar3 = ms->hashTable;
    cVar5 = (char)ms->rowHashLog;
    bVar4 = 0x38 - cVar5;
    bVar10 = 0x18 - cVar5;
    do {
      uVar15 = ms->hashSalt;
      if (uVar17 == 5) {
        uVar15 = (*(long *)(pBVar1 + uVar18) * -0x30e4432345000000 ^ uVar15) >> (bVar4 & 0x3f);
        lVar19 = (uVar15 >> 8 & 0xffffff) << (bVar9 & 0x3f);
        uVar7 = pBVar2[lVar19] + 0x7f & uVar6;
        uVar16 = 0;
        if (uVar7 == 0) {
          uVar16 = uVar6;
        }
        uVar16 = uVar16 + uVar7;
        pBVar2[lVar19] = (BYTE)uVar16;
        uVar8 = *(long *)(pBVar1 + uVar18) * -0x30e4432345000000 ^ ms->hashSalt;
LAB_007efce8:
        uVar12 = uVar15 & 0xffffffff;
        BVar13 = (BYTE)uVar15;
        uVar8 = uVar8 >> (bVar4 & 0x3f);
      }
      else {
        if (uVar17 == 6) {
          uVar15 = (*(long *)(pBVar1 + uVar18) * -0x30e4432340650000 ^ uVar15) >> (bVar4 & 0x3f);
          lVar19 = (uVar15 >> 8 & 0xffffff) << (bVar9 & 0x3f);
          uVar7 = pBVar2[lVar19] + 0x7f & uVar6;
          uVar16 = 0;
          if (uVar7 == 0) {
            uVar16 = uVar6;
          }
          uVar16 = uVar16 + uVar7;
          pBVar2[lVar19] = (BYTE)uVar16;
          uVar8 = *(long *)(pBVar1 + uVar18) * -0x30e4432340650000 ^ ms->hashSalt;
          goto LAB_007efce8;
        }
        uVar11 = (*(int *)(pBVar1 + uVar18) * -0x61c8864f ^ (uint)uVar15) >> (bVar10 & 0x1f);
        uVar12 = (ulong)uVar11;
        lVar19 = (ulong)(uVar11 >> 8) << (bVar9 & 0x3f);
        uVar7 = pBVar2[lVar19] + 0x7f & uVar6;
        uVar16 = 0;
        if (uVar7 == 0) {
          uVar16 = uVar6;
        }
        uVar16 = uVar16 + uVar7;
        pBVar2[lVar19] = (BYTE)uVar16;
        uVar8 = (ulong)((*(int *)(pBVar1 + uVar18) * -0x61c8864f ^ (uint)ms->hashSalt) >>
                       (bVar10 & 0x1f));
        BVar13 = (BYTE)uVar11;
      }
      if (uVar8 != uVar12) {
        __assert_fail("hash == ZSTD_hashPtrSalted(base + updateStartIdx, hashLog + ZSTD_ROW_HASH_TAG_BITS, mls, ms->hashSalt)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                      ,0x375,
                      "void ZSTD_row_update_internalImpl(ZSTD_matchState_t *, U32, const U32, const U32, const U32, const U32, const U32)"
                     );
      }
      pBVar2[(ulong)uVar16 + lVar19] = BVar13;
      pUVar3[lVar19 + (ulong)uVar16] = (U32)uVar18;
      uVar18 = uVar18 + 1;
    } while (uVar18 < ((long)ip - (long)pBVar1 & 0xffffffffU));
  }
  ms->nextToUpdate = uVar14;
  return;
}

Assistant:

void ZSTD_row_update(ZSTD_matchState_t* const ms, const BYTE* ip) {
    const U32 rowLog = BOUNDED(4, ms->cParams.searchLog, 6);
    const U32 rowMask = (1u << rowLog) - 1;
    const U32 mls = MIN(ms->cParams.minMatch, 6 /* mls caps out at 6 */);

    DEBUGLOG(5, "ZSTD_row_update(), rowLog=%u", rowLog);
    ZSTD_row_update_internal(ms, ip, mls, rowLog, rowMask, 0 /* don't use cache */);
}